

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O3

void __thiscall MathOp::RevealD::forward(RevealD *this)

{
  int *piVar1;
  bool bVar2;
  
  Op::reinit(&this->super_Op);
  if ((this->super_Op).forwardRound == 1) {
    (**(this->pDegRed->super_Op)._vptr_Op)();
    (**(this->pReveal->super_Op)._vptr_Op)();
    bVar2 = Op::forwardHasNext(&this->pReveal->super_Op);
    if ((!bVar2) && (bVar2 = Op::forwardHasNext(&this->pDegRed->super_Op), !bVar2)) {
      return;
    }
    piVar1 = &(this->super_Op).forwardRound;
    *piVar1 = *piVar1 + -1;
  }
  return;
}

Assistant:

void MathOp::RevealD::forward() {
    reinit();
    switch (forwardRound) {
        case 1:
            pDegRed->forward();
            pReveal->forward();
            if (pReveal->forwardHasNext() || pDegRed->forwardHasNext()) {
                forwardRound--;
            }
//            pReveal->forward();
//            if (pReveal->forwardHasNext()) {
//                forwardRound--;
//            }
            break;
    }
}